

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

char * vrna_ptypes(short *S,vrna_md_t *md)

{
  int iVar1;
  uint length;
  uint uVar2;
  int *__ptr;
  int local_58;
  int local_54;
  int otype;
  int ntype;
  int type;
  int min_loop_size;
  int *idx;
  int local_38;
  int l;
  int k;
  int j;
  int i;
  int n;
  char *ptype;
  vrna_md_t *md_local;
  short *S_local;
  
  iVar1 = md->min_loop_size;
  length = (uint)*S;
  uVar2 = vrna_sequence_length_max(0);
  if (uVar2 < length) {
    vrna_message_warning
              ("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
               (ulong)length);
    S_local = (short *)0x0;
  }
  else {
    S_local = (short *)vrna_alloc((int)(length * (length + 1)) / 2 + 2);
    __ptr = vrna_idx_col_wise(length);
    for (local_38 = 1; local_38 < (int)(length - iVar1); local_38 = local_38 + 1) {
      for (idx._4_4_ = 1; idx._4_4_ < 3; idx._4_4_ = idx._4_4_ + 1) {
        local_54 = 0;
        local_58 = 0;
        k = local_38;
        l = local_38 + iVar1 + idx._4_4_;
        if (l <= (int)length) {
          otype = md->pair[S[local_38]][S[l]];
          for (; 0 < k && l <= (int)length; k = k + -1) {
            if ((1 < k) && (l < (int)length)) {
              local_54 = md->pair[S[k + -1]][S[l + 1]];
            }
            if (((md->noLP != 0) && (local_58 == 0)) && (local_54 == 0)) {
              otype = 0;
            }
            *(char *)((long)S_local + (long)(__ptr[l] + k)) = (char)otype;
            local_58 = otype;
            otype = local_54;
            l = l + 1;
          }
        }
      }
    }
    free(__ptr);
  }
  return (char *)S_local;
}

Assistant:

PUBLIC char *
vrna_ptypes(const short *S,
            vrna_md_t   *md)
{
  char  *ptype;
  int   n, i, j, k, l, *idx;
  int   min_loop_size = md->min_loop_size;

  n = S[0];

  if ((unsigned int)n > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
    vrna_message_warning("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                         n);
    return NULL;
  }

  ptype = (char *)vrna_alloc(sizeof(char) * ((n * (n + 1)) / 2 + 2));
  idx   = vrna_idx_col_wise(n);

  for (k = 1; k < n - min_loop_size; k++)
    for (l = 1; l <= 2; l++) {
      int type, ntype = 0, otype = 0;
      i = k;
      j = i + min_loop_size + l;
      if (j > n)
        continue;

      type = md->pair[S[i]][S[j]];
      while ((i >= 1) && (j <= n)) {
        if ((i > 1) && (j < n))
          ntype = md->pair[S[i - 1]][S[j + 1]];

        if (md->noLP && (!otype) && (!ntype))
          type = 0; /* i.j can only form isolated pairs */

        ptype[idx[j] + i] = (char)type;
        otype             = type;
        type              = ntype;
        i--;
        j++;
      }
    }
  free(idx);
  return ptype;
}